

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def_property_readonly<unsigned_long(anurbs::Model::*)()const>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name,
          offset_in_Model_to_subr *fget)

{
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *pcVar1;
  return_value_policy local_49;
  offset_in_Model_to_subr local_48;
  void *local_38;
  offset_in_Model_to_subr local_30;
  cpp_function local_28;
  offset_in_Model_to_subr *local_20;
  offset_in_Model_to_subr *fget_local;
  char *name_local;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *this_local;
  
  local_38 = (void *)*fget;
  local_30 = fget[1];
  local_20 = fget;
  fget_local = (offset_in_Model_to_subr *)name;
  name_local = (char *)this;
  local_48 = _anurbs__Model___pybind11__method_adaptor<anurbs::Model,unsigned_long,anurbs::Model>_unsigned_long_anurbs__Model______const__
                       (local_38,local_30);
  cpp_function::cpp_function<unsigned_long,anurbs::Model>(&local_28,local_48);
  local_49 = reference_internal;
  pcVar1 = class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_>::
           def_property_readonly<pybind11::return_value_policy>
                     ((class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this,name,&local_28,
                      &local_49);
  cpp_function::~cpp_function(&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }